

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

string * ItemSerialize(string *__return_storage_ptr__,
                      list<Character_Item,_std::allocator<Character_Item>_> *list)

{
  int in_EDX;
  int subject;
  int extraout_EDX;
  _List_node_base *p_Var1;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  p_Var1 = (_List_node_base *)list;
  while (p_Var1 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)&p_Var1->_M_next)
                  ->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)list) {
    util::to_string_abi_cxx11_
              (&local_50,(util *)(ulong)(uint)(int)*(short *)&p_Var1[1]._M_next,in_EDX);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    util::to_string_abi_cxx11_
              (&local_50,(util *)(ulong)*(uint *)((long)&p_Var1[1]._M_next + 4),subject);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    in_EDX = extraout_EDX;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ItemSerialize(const std::list<Character_Item> &list)
{
	std::string serialized;

	UTIL_CIFOREACH(list, item)
	{
		serialized.append(util::to_string(item->id));
		serialized.append(",");
		serialized.append(util::to_string(item->amount));
		serialized.append(";");
	}

	return serialized;
}